

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O3

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  size_t y;
  size_t x;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  TGAColor local_130;
  int local_128;
  int local_124;
  size_t local_120;
  ulong local_118;
  TGAImage *local_110;
  Model *local_108;
  IShader *local_100;
  double local_f8;
  vec3f local_f0;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  
  lVar5 = 0;
  auVar7 = _DAT_001073c0;
  auVar10 = _DAT_001073b0;
  do {
    uVar1 = *(undefined8 *)((long)pts._M_elems[0].data + lVar5 + 0x18);
    auVar6._8_8_ = uVar1;
    auVar6._0_8_ = uVar1;
    auVar6 = divpd(*(undefined1 (*) [16])((long)pts._M_elems[0].data + lVar5),auVar6);
    auVar10 = maxpd(auVar6,auVar10);
    auVar7 = minpd(auVar6,auVar7);
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x60);
  local_130.bytespp = '\0';
  local_130.bgra[0] = '\0';
  local_130.bgra[1] = '\0';
  local_130.bgra[2] = '\0';
  local_130.bgra[3] = '\0';
  if ((int)auVar7._0_8_ <= (int)auVar10._0_8_) {
    local_124 = (int)auVar7._8_8_;
    local_118 = (ulong)(uint)(int)auVar10._8_8_;
    local_120 = (size_t)local_124;
    x = (size_t)(int)auVar7._0_8_;
    local_128 = (int)auVar10._0_8_ + 1;
    local_58 = pts._M_elems[0].data[2];
    dStack_50 = pts._M_elems[0].data[3];
    auVar7._8_8_ = pts._M_elems[0].data[3];
    auVar7._0_8_ = pts._M_elems[0].data[3];
    local_48 = divpd((undefined1  [16])pts._M_elems[0].data._0_16_,auVar7);
    local_98 = local_48._8_8_;
    local_78 = pts._M_elems[1].data[2];
    dStack_70 = pts._M_elems[1].data[3];
    auVar8._8_8_ = pts._M_elems[1].data[3];
    auVar8._0_8_ = pts._M_elems[1].data[3];
    local_68 = divpd((undefined1  [16])pts._M_elems[1].data._0_16_,auVar8);
    local_b8 = local_68._8_8_;
    local_88 = pts._M_elems[2].data[2];
    dStack_80 = pts._M_elems[2].data[3];
    auVar9._8_8_ = pts._M_elems[2].data[3];
    auVar9._0_8_ = pts._M_elems[2].data[3];
    local_a8 = divpd((undefined1  [16])pts._M_elems[2].data._0_16_,auVar9);
    local_c8 = local_a8._8_8_;
    lVar5 = x * 8;
    local_110 = image;
    local_108 = model;
    local_100 = shader;
    dStack_c0 = local_c8;
    dStack_b0 = local_b8;
    dStack_90 = local_98;
    do {
      if (local_124 <= (int)local_118) {
        local_f8 = (double)(int)x;
        y = local_120;
        do {
          P.y = (double)(int)y;
          A.y = local_98;
          A.x = (double)local_48._0_8_;
          B.y = local_b8;
          B.x = (double)local_68._0_8_;
          C.y = local_c8;
          C.x = (double)local_a8._0_8_;
          P.x = local_f8;
          barycentric(&local_f0,A,B,C,P);
          dVar3 = local_f0.z * dStack_80 + local_f0.x * dStack_50 + local_f0.y * dStack_70;
          dVar2 = (local_f0.z * local_88 + local_f0.x * local_58 + local_f0.y * local_78) / dVar3 +
                  0.5;
          if (255.0 <= dVar2) {
            dVar2 = 255.0;
          }
          if (((0.0 <= local_f0.x) && (0.0 <= local_f0.y)) && (0.0 <= local_f0.z)) {
            if (dVar2 <= 0.0) {
              dVar2 = 0.0;
            }
            if (*(double *)
                 ((long)(zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + y * 8 + zbuffer->width * lVar5) <= dVar2)
            {
              local_d8._8_4_ = SUB84(dVar3,0);
              local_d8._0_8_ = dVar2;
              local_d8._12_4_ = (int)((ulong)dVar3 >> 0x20);
              iVar4 = (*local_100->_vptr_IShader[3])(local_100,local_108,&local_130);
              if ((char)iVar4 == '\0') {
                *(long *)((long)(zbuffer->data).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         y * 8 + zbuffer->width * lVar5) = local_d8._0_8_;
                TGAImage::set(local_110,x,y,&local_130);
              }
            }
          }
          y = y + 1;
        } while ((int)auVar10._8_8_ + 1U != (int)y);
      }
      x = x + 1;
      lVar5 = lVar5 + 8;
    } while (local_128 != (int)x);
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f c = barycentric(proj<2, 4>(pts[0] / pts[0][3]), proj<2, 4>(pts[1] / pts[1][3]),
                                  proj<2, 4>(pts[2] / pts[2][3]), to_f(proj<2, 2>(P)));
            double z = pts[0][2] * c.x + pts[1][2] * c.y + pts[2][2] * c.z;
            double w = pts[0][3] * c.x + pts[1][3] * c.y + pts[2][3] * c.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (c.x < 0 || c.y < 0 || c.z < 0 || zbuffer.get(P.x, P.y) > frag_depth) continue;
            bool discard = shader.fragment(model, c, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}